

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::addTestCasesWithFunctions
               (TestCaseGroup *group,Function initPrograms,Function testFunc)

{
  int iVar1;
  TestCaseGroup *pTVar2;
  TestContext *pTVar3;
  char *pcVar4;
  ostream *this;
  TestNode *pTVar5;
  TestNode *node;
  Function in_RCX;
  VkFormat format_00;
  CaseDef local_2d8;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  undefined1 local_27c [8];
  CaseDef caseDef;
  ostringstream caseName;
  int local_f0;
  DefaultDeleter<tcu::TestCaseGroup> local_ea;
  undefined1 local_e9;
  int samplesNdx;
  undefined1 local_c8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  int formatNdx;
  undefined1 local_80 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sizeLayerGroup;
  int layerNdx;
  int sizeNdx;
  VkFormat format [4];
  VkSampleCountFlagBits samples [6];
  int numLayers [2];
  IVec2 size [2];
  Function testFunc_local;
  Function initPrograms_local;
  TestCaseGroup *group_local;
  
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)numLayers,0x40,0x40);
  tcu::Vector<int,_2>::Vector(size,0x4f,0x1f);
  samples[4] = VK_SAMPLE_COUNT_1_BIT;
  samples[5] = VK_SAMPLE_COUNT_4_BIT;
  format[2] = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  format[3] = VK_FORMAT_R5G6B5_UNORM_PACK16;
  samples[0] = VK_SAMPLE_COUNT_8_BIT;
  samples[1] = VK_SAMPLE_COUNT_16_BIT;
  samples[2] = VK_SAMPLE_COUNT_32_BIT;
  samples[3] = VK_SAMPLE_COUNT_64_BIT;
  _layerNdx = 0x6200000025;
  format[0] = VK_FORMAT_R16G16_SINT;
  format[1] = VK_FORMAT_R32G32B32A32_SFLOAT;
  for (sizeLayerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._12_4_ = 0;
      (int)sizeLayerGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ < 2;
      sizeLayerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._12_4_ =
           sizeLayerGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ + 1) {
    for (sizeLayerGroup.
         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_4_
              = 0; iVar1 = (int)in_RCX,
        (int)sizeLayerGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _8_4_ < 2;
        sizeLayerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
        .m_data._8_4_ =
             sizeLayerGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _8_4_ + 1) {
      pTVar2 = (TestCaseGroup *)operator_new(0x70);
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._15_1_ = 1;
      pTVar3 = tcu::TestNode::getTestContext(&group->super_TestNode);
      pipeline::(anonymous_namespace)::getSizeLayerString_abi_cxx11_
                ((string *)&formatNdx,
                 (_anonymous_namespace_ *)
                 (size + (long)(int)sizeLayerGroup.
                                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                    .m_data._12_4_ + -1),
                 (IVec2 *)(ulong)samples[(long)(int)sizeLayerGroup.
                                                                                                        
                                                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                                  .m_data._8_4_ + 4],iVar1);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      in_RCX = (Function)0x12be863;
      tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,pcVar4,"");
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._15_1_ = 0;
      de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                ((DefaultDeleter<tcu::TestCaseGroup> *)
                 &formatGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0xe);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_80,
                 pTVar2);
      std::__cxx11::string::~string((string *)&formatNdx);
      for (formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data._8_4_ = 0;
          (int)formatGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               _8_4_ < 4;
          formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
          m_data._8_4_ = formatGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._8_4_ + 1) {
        pTVar2 = (TestCaseGroup *)operator_new(0x70);
        local_e9 = 1;
        pTVar3 = tcu::TestNode::getTestContext(&group->super_TestNode);
        pipeline::(anonymous_namespace)::getFormatString_abi_cxx11_
                  ((string *)&samplesNdx,
                   (_anonymous_namespace_ *)
                   (ulong)(uint)(&layerNdx)
                                [(int)formatGroup.
                                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                      .m_data._8_4_],format_00);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        in_RCX = (Function)0x12be863;
        tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,pcVar4,"");
        local_e9 = 0;
        de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_ea);
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_c8,
                   pTVar2);
        std::__cxx11::string::~string((string *)&samplesNdx);
        for (local_f0 = 0; local_f0 < 6; local_f0 = local_f0 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&caseDef.colorFormat);
          this = std::operator<<((ostream *)&caseDef.colorFormat,"samples_");
          iVar1 = getNumSamples(format[(long)local_f0 + 2]);
          std::ostream::operator<<(this,iVar1);
          tcu::Vector<int,_2>::Vector
                    ((Vector<int,_2> *)local_27c,
                     size + (long)(int)sizeLayerGroup.
                                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                       .m_data._12_4_ + -1);
          caseDef.renderSize.m_data[0] =
               samples[(long)(int)sizeLayerGroup.
                                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                  .m_data._8_4_ + 4];
          caseDef.renderSize.m_data[1] =
               (&layerNdx)
               [(int)formatGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_];
          caseDef.numLayers = format[(long)local_f0 + 2];
          pTVar2 = de::details::
                   UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                             ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               *)local_c8);
          std::__cxx11::ostringstream::str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
          CaseDef::CaseDef(&local_2d8,(CaseDef *)local_27c);
          in_RCX = initPrograms;
          addFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
                    (pTVar2,&local_2a0,&local_2c0,initPrograms,testFunc,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&caseDef.colorFormat);
        }
        pTVar5 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_80)->super_TestNode;
        node = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_c8)->super_TestNode;
        tcu::TestNode::addChild(pTVar5,node);
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_c8)
        ;
      }
      pTVar5 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_80)->super_TestNode;
      tcu::TestNode::addChild(&group->super_TestNode,pTVar5);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_80);
    }
  }
  return;
}

Assistant:

void addTestCasesWithFunctions (tcu::TestCaseGroup*						group,
								FunctionPrograms1<CaseDef>::Function	initPrograms,
								FunctionInstance1<CaseDef>::Function	testFunc)
{
	const IVec2 size[] =
	{
		IVec2(64, 64),
		IVec2(79, 31),
	};
	const int numLayers[] =
	{
		1, 4
	};
	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};
	const VkFormat format[] =
	{
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(size); ++sizeNdx)
	for (int layerNdx = 0; layerNdx < DE_LENGTH_OF_ARRAY(numLayers); ++layerNdx)
	{
		MovePtr<tcu::TestCaseGroup>	sizeLayerGroup(new tcu::TestCaseGroup(group->getTestContext(), getSizeLayerString(size[sizeNdx], numLayers[layerNdx]).c_str(), ""));
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(format); ++formatNdx)
		{
			MovePtr<tcu::TestCaseGroup>	formatGroup(new tcu::TestCaseGroup(group->getTestContext(), getFormatString(format[formatNdx]).c_str(), ""));
			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				std::ostringstream caseName;
				caseName << "samples_" << getNumSamples(samples[samplesNdx]);

				const CaseDef caseDef =
				{
					size[sizeNdx],			// IVec2					renderSize;
					numLayers[layerNdx],	// int						numLayers;
					format[formatNdx],		// VkFormat					colorFormat;
					samples[samplesNdx],	// VkSampleCountFlagBits	numSamples;
				};

				addFunctionCaseWithPrograms(formatGroup.get(), caseName.str(), "", initPrograms, testFunc, caseDef);
			}
			sizeLayerGroup->addChild(formatGroup.release());
		}
		group->addChild(sizeLayerGroup.release());
	}
}